

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O3

void __thiscall QTipLabel::placeTip(QTipLabel *this,QPoint *pos,QWidget *w)

{
  QPoint QVar1;
  QWidgetData *pQVar2;
  QWidget *pQVar3;
  bool bVar4;
  Representation RVar5;
  long lVar6;
  undefined4 *puVar7;
  QScreen *pQVar8;
  QPlatformScreen *context;
  long *plVar9;
  QSize QVar10;
  int iVar11;
  int iVar12;
  Representation RVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  Representation RVar17;
  int iVar18;
  Representation RVar19;
  Representation RVar20;
  QTipLabel *pQVar21;
  long in_FS_OFFSET;
  QByteArrayView QVar22;
  undefined1 auVar23 [16];
  Connection local_80;
  QString local_78;
  QWidget *w_local;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  w_local = w;
  bVar4 = QWidget::testAttribute_helper((QWidget *)this,WA_StyleSheet);
  if (!bVar4) {
    if (w == (QWidget *)0x0) {
      w = (QWidget *)0x0;
      goto LAB_0039f76c;
    }
    QWidget::style(w);
    lVar6 = QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject);
    if (lVar6 == 0) goto LAB_0039f76c;
  }
  pQVar21 = instance;
  ::QVariant::QVariant((QVariant *)local_58,(QMetaType)0x8231d8,&w_local);
  QObject::doSetProperty((char *)pQVar21,(QVariant *)"_q_stylesheet_parent",(QVariant *)local_58);
  ::QVariant::~QVariant((QVariant *)local_58);
  pQVar21 = instance;
  QVar22.m_data = (storage_type *)0x5;
  QVar22.m_size = (qsizetype)local_58;
  QString::fromLatin1(QVar22);
  local_78.d.d = (Data *)local_58._0_8_;
  local_78.d.ptr = (char16_t *)local_58._8_8_;
  local_78.d.size = local_58._16_8_;
  QWidget::setStyleSheet((QWidget *)pQVar21,&local_78);
  if ((QSize)local_78.d.d != (QSize)0x0) {
    LOCK();
    *(int *)local_78.d.d = *(int *)local_78.d.d + -1;
    UNLOCK();
    if (*(int *)local_78.d.d == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar3 = w_local;
  pQVar21 = instance;
  instance->styleSheetParent = w_local;
  if (w_local != (QWidget *)0x0) {
    local_78.d.d = (Data *)styleSheetParentDestroyed;
    local_78.d.ptr = (char16_t *)0x0;
    local_58._0_8_ = QObject::destroyed;
    local_58._8_8_ = 0;
    puVar7 = (undefined4 *)operator_new(0x20);
    *puVar7 = 1;
    *(code **)(puVar7 + 2) =
         QtPrivate::QCallableObject<void_(QTipLabel::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar7 + 4) = styleSheetParentDestroyed;
    *(undefined8 *)(puVar7 + 6) = 0;
    QObject::connectImpl
              ((QObject *)&local_80,(void **)pQVar3,(QObject *)local_58,(void **)pQVar21,
               (QSlotObjectBase *)&local_78,(ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection(&local_80);
    pQVar21 = instance;
  }
  updateSize(pQVar21,pos);
  w = w_local;
LAB_0039f76c:
  QVar1 = *pos;
  local_58._0_8_ = QVar1;
  pQVar8 = getTipScreen(pos,w);
  if (pQVar8 != (QScreen *)0x0) {
    context = (QPlatformScreen *)QScreen::handle();
    if (context != (QPlatformScreen *)0x0) {
      plVar9 = (long *)(**(code **)(*(long *)context + 0xb0))(context);
      if (plVar9 == (long *)0x0) {
        local_78.d.d._0_4_ = 0x10;
        local_78.d.d._4_4_ = 0x10;
      }
      else {
        local_78.d.d = (Data *)(**(code **)(*plVar9 + 0x90))(plVar9);
      }
      QVar10 = QHighDpi::fromNativePixels<QSize,QPlatformScreen>((QSize *)&local_78,context);
      pQVar2 = (this->super_QLabel).super_QFrame.super_QWidget.data;
      iVar11 = ((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i) * 2 + 2;
      RVar5 = QVar10.ht.m_i;
      iVar12 = 2;
      if (iVar11 < RVar5.m_i) {
        iVar12 = (int)(((uint)((ulong)QVar10 >> 0x1f) & 1) + QVar10.wd.m_i.m_i) >> 1;
      }
      RVar19.m_i = 0;
      if (RVar5.m_i <= iVar11) {
        RVar19.m_i = RVar5.m_i;
      }
      RVar13.m_i = iVar12 + QVar1.xp.m_i.m_i;
      RVar20.m_i = RVar19.m_i + QVar1.yp.m_i.m_i;
      local_58._4_4_ = RVar20.m_i;
      local_58._0_4_ = RVar13.m_i;
      auVar23 = QScreen::geometry();
      pQVar2 = (this->super_QLabel).super_QFrame.super_QWidget.data;
      iVar11 = (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i;
      iVar12 = iVar11 + 1;
      iVar14 = auVar23._8_4_ + 1;
      if (iVar14 < iVar11 + RVar13.m_i + 1) {
        RVar13.m_i = (RVar13.m_i - iVar12) + -4;
        local_58._0_4_ = RVar13.m_i;
      }
      iVar15 = (pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i;
      iVar18 = iVar15 + RVar20.m_i + 1;
      iVar15 = iVar15 + 1;
      iVar11 = auVar23._12_4_ + 1;
      RVar17.m_i = (RVar20.m_i - iVar15) + -0x18;
      if (iVar18 <= iVar11) {
        RVar17.m_i = RVar20.m_i;
      }
      iVar16 = auVar23._4_4_;
      RVar20.m_i = iVar16;
      if (iVar16 < RVar17.m_i) {
        RVar20.m_i = RVar17.m_i;
      }
      if ((iVar11 < iVar18) || (RVar17.m_i < iVar16)) {
        local_58._4_4_ = RVar20.m_i;
      }
      iVar18 = iVar14 - iVar12;
      if (iVar12 + RVar13.m_i <= iVar14) {
        iVar18 = RVar13.m_i;
      }
      RVar17.m_i = auVar23._0_4_;
      if ((iVar14 < iVar12 + RVar13.m_i) || (iVar18 < RVar17.m_i)) {
        if (RVar17.m_i < iVar18) {
          RVar17.m_i = iVar18;
        }
        local_58._0_4_ = RVar17.m_i;
      }
      if (iVar11 < RVar20.m_i + iVar15) {
        local_58._4_4_ = iVar11 - iVar15;
      }
    }
  }
  QWidget::move((QWidget *)this,(QPoint *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTipLabel::placeTip(const QPoint &pos, QWidget *w)
{
#ifndef QT_NO_STYLE_STYLESHEET
    if (testAttribute(Qt::WA_StyleSheet) || (w && qt_styleSheet(w->style()))) {
        //the stylesheet need to know the real parent
        QTipLabel::instance->setProperty("_q_stylesheet_parent", QVariant::fromValue(w));
        //we force the style to be the QStyleSheetStyle, and force to clear the cache as well.
        QTipLabel::instance->setStyleSheet("/* */"_L1);

        // Set up for cleaning up this later...
        QTipLabel::instance->styleSheetParent = w;
        if (w) {
            connect(w, &QWidget::destroyed,
                    QTipLabel::instance, &QTipLabel::styleSheetParentDestroyed);
        }
        // QTBUG-64550: A font inherited by the style sheet might change the size,
        // particular on Windows, where the tip is not parented on a window.
        // The updatesSize() also makes sure that the content size be updated with
        // correct content margin.
        QTipLabel::instance->updateSize(pos);
    }
#endif //QT_NO_STYLE_STYLESHEET

    QPoint p = pos;
    const QScreen *screen = getTipScreen(pos, w);
    // a QScreen's handle *should* never be null, so this is a bit paranoid
    if (const QPlatformScreen *platformScreen = screen ? screen->handle() : nullptr) {
        QPlatformCursor *cursor = platformScreen->cursor();
        // default implementation of QPlatformCursor::size() returns QSize(16, 16)
        const QSize nativeSize = cursor ? cursor->size() : QSize(16, 16);
        const QSize cursorSize = QHighDpi::fromNativePixels(nativeSize,
                                                            platformScreen);
        QPoint offset(2, cursorSize.height());
        // assuming an arrow shape, we can just move to the side for very large cursors
        if (cursorSize.height() > 2 * this->height())
            offset = QPoint(cursorSize.width() / 2, 0);

        p += offset;

        QRect screenRect = screen->geometry();
        if (p.x() + this->width() > screenRect.x() + screenRect.width())
        p.rx() -= 4 + this->width();
        if (p.y() + this->height() > screenRect.y() + screenRect.height())
        p.ry() -= 24 + this->height();
        if (p.y() < screenRect.y())
            p.setY(screenRect.y());
        if (p.x() + this->width() > screenRect.x() + screenRect.width())
            p.setX(screenRect.x() + screenRect.width() - this->width());
        if (p.x() < screenRect.x())
            p.setX(screenRect.x());
        if (p.y() + this->height() > screenRect.y() + screenRect.height())
            p.setY(screenRect.y() + screenRect.height() - this->height());
    }
    this->move(p);
}